

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

bool __thiscall ON_BrepRegion::Read(ON_BrepRegion *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_BrepRegion *this_local;
  
  iStack_24 = 0;
  local_28 = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if ((((local_29) &&
         (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_region_index), local_29)) &&
        (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_type), local_29)) &&
       (local_29 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_fsi), local_29)) {
      local_29 = ON_BinaryArchive::ReadBoundingBox(_minor_version,&this->m_bbox);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BrepRegion::Read(ON_BinaryArchive& file)
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;
  for(;;)
  {
    rc = (1==major_version);
    if (!rc) break;
    rc = file.ReadInt( &m_region_index );
    if (!rc) break;
    rc = file.ReadInt( &m_type );
    if (!rc) break;
    rc = file.ReadArray( m_fsi );
    if (!rc) break;
    rc = file.ReadBoundingBox( m_bbox );
    if (!rc) break;

    break;
  }
  if (!file.EndRead3dmChunk())
    rc = false;
  return rc;
}